

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O1

Scalar RigidBodyDynamics::Utils::CalcKineticEnergy
                 (Model *model,VectorNd *q,VectorNd *qdot,bool update_kinematics)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  pointer pSVar4;
  undefined7 in_register_00000009;
  long lVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  if ((int)CONCAT71(in_register_00000009,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,q,qdot,(VectorNd *)0x0);
  }
  dVar8 = 0.0;
  if (1 < (ulong)(((long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)) {
    uVar6 = 1;
    lVar7 = 0x30;
    lVar5 = 0x50;
    do {
      pSVar4 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      Math::SpatialRigidBodyInertia::operator*
                ((SpatialRigidBodyInertia *)
                 ((long)&(((model->I).
                           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d +
                 lVar5 + -8),
                 (SpatialVector *)
                 ((long)&(pSVar4->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar7));
      pdVar1 = (double *)
               ((long)&(pSVar4->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar7);
      pdVar2 = (double *)
               ((long)&(pSVar4->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar7 + 0x10);
      pdVar3 = (double *)
               ((long)&(pSVar4->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar7 + 0x20);
      dVar8 = dVar8 + pdVar3[1] * 0.5 * dStack_40 + pdVar2[1] * 0.5 * dStack_50 +
                      pdVar1[1] * 0.5 * dStack_60 +
                      *pdVar3 * 0.5 * local_48 + *pdVar2 * 0.5 * local_58 + *pdVar1 * 0.5 * local_68
      ;
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x30;
      lVar5 = lVar5 + 0x50;
    } while (uVar6 < (ulong)(((long)(model->mBodies).
                                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                    .
                                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(model->mBodies).
                                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                    .
                                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            0x6db6db6db6db6db7));
  }
  return dVar8;
}

Assistant:

RBDL_DLLAPI Scalar CalcKineticEnergy (
  Model &model,
  const Math::VectorNd &q,
  const Math::VectorNd &qdot,
  bool update_kinematics)
{
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &q, &qdot, NULL);
  }

  Scalar result = 0.;

  for (size_t i = 1; i < model.mBodies.size(); i++) {
    result += 0.5 * model.v[i].transpose() * (model.I[i] * model.v[i]);
  }
  return result;
}